

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O2

void __thiscall duckdb::RleBpDecoder::Skip(RleBpDecoder *this,uint32_t batch_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
LAB_01f62f5f:
  do {
    uVar2 = batch_size - uVar4;
    if (batch_size < uVar4 || uVar2 == 0) {
      return;
    }
    uVar1 = this->repeat_count_;
    if (uVar1 == 0) {
      uVar3 = this->literal_count_;
      if (uVar3 == 0) {
        NextCounts(this);
        goto LAB_01f62f5f;
      }
      if (uVar2 < uVar3) {
        uVar3 = uVar2;
      }
      ParquetDecodeUtils::Skip
                (&this->buffer_,&this->bitpack_pos,(ulong)uVar3,(bitpacking_width_t)this->bit_width_
                );
      this->literal_count_ = this->literal_count_ - uVar3;
    }
    else {
      uVar3 = uVar2;
      if (uVar1 <= uVar2) {
        uVar3 = uVar1;
      }
      this->repeat_count_ = uVar1 - uVar3;
    }
    uVar4 = uVar4 + uVar3;
  } while( true );
}

Assistant:

void Skip(uint32_t batch_size) {
		uint32_t values_skipped = 0;

		while (values_skipped < batch_size) {
			if (repeat_count_ > 0) {
				auto repeat_batch = MinValue<uint32_t>(batch_size - values_skipped, repeat_count_);
				repeat_count_ -= repeat_batch;
				values_skipped += repeat_batch;
			} else if (literal_count_ > 0) {
				auto literal_batch = MinValue<uint32_t>(batch_size - values_skipped, literal_count_);
				ParquetDecodeUtils::Skip(buffer_, bitpack_pos, literal_batch, bit_width_);
				literal_count_ -= literal_batch;
				values_skipped += literal_batch;
			} else {
				NextCounts();
			}
		}
		D_ASSERT(values_skipped == batch_size);
	}